

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxForceFeedback.cpp
# Opt level: O2

void __thiscall OIS::LinuxForceFeedback::_stop(LinuxForceFeedback *this,int handle)

{
  ssize_t sVar1;
  undefined8 *puVar2;
  input_event stop;
  
  stop.type = 0x15;
  stop.code = (__u16)handle;
  stop.value = 0;
  sVar1 = write(this->mJoyStick,&stop,0x18);
  if (sVar1 == 0x18) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x20);
  *puVar2 = &PTR__exception_0012b8c8;
  puVar2[1] = 0x21a00000008;
  puVar2[2] = 
  "/workspace/llm4binary/github/license_c_cmakelists/wgois[P]OIS/src/linux/LinuxForceFeedback.cpp";
  puVar2[3] = "Unknown error stopping effect->..";
  __cxa_throw(puVar2,&Exception::typeinfo,std::exception::~exception);
}

Assistant:

void LinuxForceFeedback::_stop(int handle)
{
	struct input_event stop;

	stop.type  = EV_FF;
	stop.code  = handle;
	stop.value = 0;

#if(OIS_LINUX_JOYFF_DEBUG > 1)
	cout << endl
		 << "LinuxForceFeedback(" << mJoyStick
		 << ") : Stopping effect with handle " << handle << endl;
#endif

	if(write(mJoyStick, &stop, sizeof(stop)) != sizeof(stop))
	{
		OIS_EXCEPT(E_General, "Unknown error stopping effect->..");
	}
}